

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O1

EventSource __thiscall XMISong::FindNextDue(XMISong *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  bVar1 = this->CurrSong->Finished;
  if ((bVar1 == true) && ((this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count == 0)) {
    return EVENT_None;
  }
  uVar2 = 0xffffffff;
  uVar3 = 0xffffffff;
  if (bVar1 == false) {
    uVar3 = this->CurrSong->Delay;
  }
  if ((this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count != 0) {
    uVar2 = ((this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array)->Delay;
  }
  return EVENT_Fake - (uVar3 < uVar2);
}

Assistant:

XMISong::EventSource XMISong::FindNextDue()
{
	// Are there still events available?
	if (CurrSong->Finished && NoteOffs.Size() == 0)
	{
		return EVENT_None;
	}

	// Which is due sooner? The current song or the note-offs?
	DWORD real_delay = CurrSong->Finished ? 0xFFFFFFFF : CurrSong->Delay;
	DWORD fake_delay = NoteOffs.Size() == 0 ? 0xFFFFFFFF : NoteOffs[0].Delay;

	return (fake_delay <= real_delay) ? EVENT_Fake : EVENT_Real;
}